

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int source_get_expiry_policy(SOURCE_HANDLE source,terminus_expiry_policy *expiry_policy_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  undefined8 in_RAX;
  AMQP_VALUE value;
  uint32_t item_count;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  if (source == (SOURCE_HANDLE)0x0) {
    return 0x310b;
  }
  iVar1 = amqpvalue_get_composite_item_count(source->composite_value,&local_14);
  if (iVar1 != 0) {
    return 0x3113;
  }
  if (((2 < local_14) &&
      (value = amqpvalue_get_composite_item_in_place(source->composite_value,2),
      value != (AMQP_VALUE)0x0)) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
    iVar1 = amqpvalue_get_symbol(value,expiry_policy_value);
    if (iVar1 == 0) {
      return 0;
    }
    AVar2 = amqpvalue_get_type(value);
    if (AVar2 != AMQP_TYPE_NULL) {
      return 0x312c;
    }
  }
  *expiry_policy_value = "session-end";
  return 0;
}

Assistant:

int source_get_expiry_policy(SOURCE_HANDLE source, terminus_expiry_policy* expiry_policy_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        if (amqpvalue_get_composite_item_count(source_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 2)
            {
                *expiry_policy_value = terminus_expiry_policy_session_end;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(source_instance->composite_value, 2);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *expiry_policy_value = terminus_expiry_policy_session_end;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_terminus_expiry_policy(item_value, expiry_policy_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *expiry_policy_value = terminus_expiry_policy_session_end;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}